

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::ConvertBlendFile
          (BlenderImporter *this,aiScene *out,Scene *in,FileDatabase *file)

{
  Object *obj;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  aiNode *paVar4;
  size_type sVar5;
  aiNode **__s;
  reference ppOVar6;
  mywrap *pmVar7;
  aiMesh **ppaVar8;
  iterator __first;
  iterator __last;
  mywrap *pmVar9;
  aiLight **ppaVar10;
  iterator __first_00;
  iterator __last_00;
  mywrap *pmVar11;
  aiCamera **ppaVar12;
  iterator __first_01;
  iterator __last_01;
  mywrap *pmVar13;
  aiMaterial **ppaVar14;
  iterator __first_02;
  iterator __last_02;
  mywrap *pmVar15;
  aiTexture **ppaVar16;
  iterator __first_03;
  iterator __last_03;
  ulong __n;
  pair<std::_Rb_tree_const_iterator<const_Assimp::Blender::Object_*>,_bool> pVar17;
  aiMatrix4x4t<float> local_2c8;
  uint local_288;
  undefined1 local_282;
  allocator<char> local_281;
  uint i;
  aiNode *local_260;
  aiNode *root;
  string local_250;
  _Base_ptr local_230;
  undefined1 local_228;
  element_type *local_220;
  undefined1 local_218 [8];
  shared_ptr<Assimp::Blender::Base> cur_1;
  element_type *local_1f8;
  element_type *local_1f0;
  undefined1 local_1e8 [8];
  shared_ptr<Assimp::Blender::Base> cur;
  undefined1 local_1c8 [8];
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  no_parents;
  ConversionData conv;
  FileDatabase *file_local;
  Scene *in_local;
  aiScene *out_local;
  BlenderImporter *this_local;
  
  conv.db = file;
  Blender::ConversionData::ConversionData
            ((ConversionData *)
             &no_parents.
              super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,file);
  std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  deque((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> *)
        local_1c8);
  std::static_pointer_cast<Assimp::Blender::Base,Assimp::Blender::ElemBase>
            ((shared_ptr<Assimp::Blender::ElemBase> *)local_1e8);
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e8), bVar1) {
    peVar2 = std::
             __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1e8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->object);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1e8);
      peVar3 = std::
               __shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar2->object);
      if (peVar3->parent == (Object *)0x0) {
        peVar2 = std::
                 __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1e8);
        local_1f0 = std::__shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(peVar2->object).
                                super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>
                              );
        std::
        deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
        push_back((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                   *)local_1c8,&local_1f0);
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1e8);
        local_1f8 = std::__shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(peVar2->object).
                                super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>
                              );
        pVar17 = std::
                 set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
                 ::insert((set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
                           *)&no_parents.
                              super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_1f8);
        cur_1.super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar17.first._M_node;
      }
    }
    peVar2 = std::
             __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1e8);
    std::shared_ptr<Assimp::Blender::Base>::operator=
              ((shared_ptr<Assimp::Blender::Base> *)local_1e8,&peVar2->next);
  }
  std::shared_ptr<Assimp::Blender::Base>::~shared_ptr
            ((shared_ptr<Assimp::Blender::Base> *)local_1e8);
  std::shared_ptr<Assimp::Blender::Base>::shared_ptr
            ((shared_ptr<Assimp::Blender::Base> *)local_218,&in->basact);
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_218), bVar1) {
    peVar2 = std::
             __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_218);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->object);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_218);
      peVar3 = std::
               __shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar2->object);
      if (peVar3->parent != (Object *)0x0) {
        peVar2 = std::
                 __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_218);
        local_220 = std::__shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(peVar2->object).
                                super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>
                              );
        pVar17 = std::
                 set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
                 ::insert((set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
                           *)&no_parents.
                              super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_220);
        local_230 = (_Base_ptr)pVar17.first._M_node;
        local_228 = pVar17.second;
      }
    }
    peVar2 = std::
             __shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_218);
    std::shared_ptr<Assimp::Blender::Base>::operator=
              ((shared_ptr<Assimp::Blender::Base> *)local_218,&peVar2->next);
  }
  std::shared_ptr<Assimp::Blender::Base>::~shared_ptr
            ((shared_ptr<Assimp::Blender::Base> *)local_218);
  bVar1 = std::
          deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
          empty((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                 *)local_1c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"Expected at least one object with no parent",
               (allocator<char> *)((long)&root + 7));
    LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)((long)&root + 7));
  }
  paVar4 = (aiNode *)operator_new(0x478);
  local_282 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"<BlenderRoot>",&local_281);
  aiNode::aiNode(paVar4,(string *)&i);
  local_282 = 0;
  out->mRootNode = paVar4;
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_281);
  local_260 = paVar4;
  sVar5 = std::
          deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
          size((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                *)local_1c8);
  local_260->mNumChildren = (uint)sVar5;
  __n = (ulong)local_260->mNumChildren << 3;
  __s = (aiNode **)operator_new__(__n);
  memset(__s,0,__n);
  local_260->mChildren = __s;
  for (local_288 = 0; local_288 < local_260->mNumChildren; local_288 = local_288 + 1) {
    ppOVar6 = std::
              deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
              ::operator[]((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                            *)local_1c8,(ulong)local_288);
    obj = *ppOVar6;
    aiMatrix4x4t<float>::aiMatrix4x4t(&local_2c8);
    paVar4 = ConvertNode(this,in,obj,
                         (ConversionData *)
                         &no_parents.
                          super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_2c8);
    local_260->mChildren[local_288] = paVar4;
    local_260->mChildren[local_288]->mParent = local_260;
  }
  BuildMaterials(this,(ConversionData *)
                      &no_parents.
                       super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
  pmVar7 = Blender::TempArray<std::vector,_aiMesh>::operator->
                     ((TempArray<std::vector,_aiMesh> *)
                      &conv.objects._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar7);
  if (sVar5 != 0) {
    pmVar7 = Blender::TempArray<std::vector,_aiMesh>::operator->
                       ((TempArray<std::vector,_aiMesh> *)
                        &conv.objects._M_t._M_impl.super__Rb_tree_header._M_node_count);
    sVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar7);
    out->mNumMeshes = (uint)sVar5;
    ppaVar8 = (aiMesh **)operator_new__((sVar5 & 0xffffffff) << 3);
    out->mMeshes = ppaVar8;
    pmVar7 = Blender::TempArray<std::vector,_aiMesh>::operator->
                       ((TempArray<std::vector,_aiMesh> *)
                        &conv.objects._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(pmVar7);
    pmVar7 = Blender::TempArray<std::vector,_aiMesh>::operator->
                       ((TempArray<std::vector,_aiMesh> *)
                        &conv.objects._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(pmVar7);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last._M_current,out->mMeshes);
    Blender::TempArray<std::vector,_aiMesh>::dismiss
              ((TempArray<std::vector,_aiMesh> *)
               &conv.objects._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  pmVar9 = Blender::TempArray<std::vector,_aiLight>::operator->
                     ((TempArray<std::vector,_aiLight> *)
                      &conv.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(pmVar9);
  if (sVar5 != 0) {
    pmVar9 = Blender::TempArray<std::vector,_aiLight>::operator->
                       ((TempArray<std::vector,_aiLight> *)
                        &conv.cameras.arr.
                         super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(pmVar9);
    out->mNumLights = (uint)sVar5;
    ppaVar10 = (aiLight **)operator_new__((sVar5 & 0xffffffff) << 3);
    out->mLights = ppaVar10;
    pmVar9 = Blender::TempArray<std::vector,_aiLight>::operator->
                       ((TempArray<std::vector,_aiLight> *)
                        &conv.cameras.arr.
                         super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    __first_00 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::begin(pmVar9);
    pmVar9 = Blender::TempArray<std::vector,_aiLight>::operator->
                       ((TempArray<std::vector,_aiLight> *)
                        &conv.cameras.arr.
                         super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    __last_00 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::end(pmVar9);
    std::
    copy<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,aiLight**>
              ((__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __first_00._M_current,
               (__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __last_00._M_current,out->mLights);
    Blender::TempArray<std::vector,_aiLight>::dismiss
              ((TempArray<std::vector,_aiLight> *)
               &conv.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  pmVar11 = Blender::TempArray<std::vector,_aiCamera>::operator->
                      ((TempArray<std::vector,_aiCamera> *)
                       &conv.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(pmVar11);
  if (sVar5 != 0) {
    pmVar11 = Blender::TempArray<std::vector,_aiCamera>::operator->
                        ((TempArray<std::vector,_aiCamera> *)
                         &conv.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(pmVar11);
    out->mNumCameras = (uint)sVar5;
    ppaVar12 = (aiCamera **)operator_new__((sVar5 & 0xffffffff) << 3);
    out->mCameras = ppaVar12;
    pmVar11 = Blender::TempArray<std::vector,_aiCamera>::operator->
                        ((TempArray<std::vector,_aiCamera> *)
                         &conv.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    __first_01 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::begin(pmVar11);
    pmVar11 = Blender::TempArray<std::vector,_aiCamera>::operator->
                        ((TempArray<std::vector,_aiCamera> *)
                         &conv.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    __last_01 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::end(pmVar11);
    std::
    copy<__gnu_cxx::__normal_iterator<aiCamera**,std::vector<aiCamera*,std::allocator<aiCamera*>>>,aiCamera**>
              ((__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__first_01._M_current,
               (__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                )__last_01._M_current,out->mCameras);
    Blender::TempArray<std::vector,_aiCamera>::dismiss
              ((TempArray<std::vector,_aiCamera> *)
               &conv.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pmVar13 = Blender::TempArray<std::vector,_aiMaterial>::operator->
                      ((TempArray<std::vector,_aiMaterial> *)
                       &conv.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(pmVar13);
  if (sVar5 != 0) {
    pmVar13 = Blender::TempArray<std::vector,_aiMaterial>::operator->
                        ((TempArray<std::vector,_aiMaterial> *)
                         &conv.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(pmVar13);
    out->mNumMaterials = (uint)sVar5;
    ppaVar14 = (aiMaterial **)operator_new__((sVar5 & 0xffffffff) << 3);
    out->mMaterials = ppaVar14;
    pmVar13 = Blender::TempArray<std::vector,_aiMaterial>::operator->
                        ((TempArray<std::vector,_aiMaterial> *)
                         &conv.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    __first_02 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(pmVar13);
    pmVar13 = Blender::TempArray<std::vector,_aiMaterial>::operator->
                        ((TempArray<std::vector,_aiMaterial> *)
                         &conv.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    __last_02 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(pmVar13);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
              ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__first_02._M_current,
               (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__last_02._M_current,out->mMaterials);
    Blender::TempArray<std::vector,_aiMaterial>::dismiss
              ((TempArray<std::vector,_aiMaterial> *)
               &conv.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pmVar15 = Blender::TempArray<std::vector,_aiTexture>::operator->
                      ((TempArray<std::vector,_aiTexture> *)
                       &conv.materials.arr.
                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(pmVar15);
  if (sVar5 != 0) {
    pmVar15 = Blender::TempArray<std::vector,_aiTexture>::operator->
                        ((TempArray<std::vector,_aiTexture> *)
                         &conv.materials.arr.
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(pmVar15);
    out->mNumTextures = (uint)sVar5;
    ppaVar16 = (aiTexture **)operator_new__((sVar5 & 0xffffffff) << 3);
    out->mTextures = ppaVar16;
    pmVar15 = Blender::TempArray<std::vector,_aiTexture>::operator->
                        ((TempArray<std::vector,_aiTexture> *)
                         &conv.materials.arr.
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    __first_03 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::begin(pmVar15);
    pmVar15 = Blender::TempArray<std::vector,_aiTexture>::operator->
                        ((TempArray<std::vector,_aiTexture> *)
                         &conv.materials.arr.
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    __last_03 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::end(pmVar15);
    std::
    copy<__gnu_cxx::__normal_iterator<aiTexture**,std::vector<aiTexture*,std::allocator<aiTexture*>>>,aiTexture**>
              ((__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__first_03._M_current,
               (__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                )__last_03._M_current,out->mTextures);
    Blender::TempArray<std::vector,_aiTexture>::dismiss
              ((TempArray<std::vector,_aiTexture> *)
               &conv.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (out->mNumMeshes == 0) {
    out->mFlags = out->mFlags | 1;
  }
  std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~deque((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> *
         )local_1c8);
  Blender::ConversionData::~ConversionData
            ((ConversionData *)
             &no_parents.
              super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return;
}

Assistant:

void BlenderImporter::ConvertBlendFile(aiScene* out, const Scene& in,const FileDatabase& file)
{
    ConversionData conv(file);

    // FIXME it must be possible to take the hierarchy directly from
    // the file. This is terrible. Here, we're first looking for
    // all objects which don't have parent objects at all -
    std::deque<const Object*> no_parents;
    for (std::shared_ptr<Base> cur = std::static_pointer_cast<Base> ( in.base.first ); cur; cur = cur->next) {
        if (cur->object) {
            if(!cur->object->parent) {
                no_parents.push_back(cur->object.get());
            } else {
                conv.objects.insert( cur->object.get() );
            }
        }
    }
    for (std::shared_ptr<Base> cur = in.basact; cur; cur = cur->next) {
        if (cur->object) {
            if(cur->object->parent) {
                conv.objects.insert(cur->object.get());
            }
        }
    }

    if (no_parents.empty()) {
        ThrowException("Expected at least one object with no parent");
    }

    aiNode* root = out->mRootNode = new aiNode("<BlenderRoot>");

    root->mNumChildren = static_cast<unsigned int>(no_parents.size());
    root->mChildren = new aiNode*[root->mNumChildren]();
    for (unsigned int i = 0; i < root->mNumChildren; ++i) {
        root->mChildren[i] = ConvertNode(in, no_parents[i], conv, aiMatrix4x4());
        root->mChildren[i]->mParent = root;
    }

    BuildMaterials(conv);

    if (conv.meshes->size()) {
        out->mMeshes = new aiMesh*[out->mNumMeshes = static_cast<unsigned int>( conv.meshes->size() )];
        std::copy(conv.meshes->begin(),conv.meshes->end(),out->mMeshes);
        conv.meshes.dismiss();
    }

    if (conv.lights->size()) {
        out->mLights = new aiLight*[out->mNumLights = static_cast<unsigned int>( conv.lights->size() )];
        std::copy(conv.lights->begin(),conv.lights->end(),out->mLights);
        conv.lights.dismiss();
    }

    if (conv.cameras->size()) {
        out->mCameras = new aiCamera*[out->mNumCameras = static_cast<unsigned int>( conv.cameras->size() )];
        std::copy(conv.cameras->begin(),conv.cameras->end(),out->mCameras);
        conv.cameras.dismiss();
    }

    if (conv.materials->size()) {
        out->mMaterials = new aiMaterial*[out->mNumMaterials = static_cast<unsigned int>( conv.materials->size() )];
        std::copy(conv.materials->begin(),conv.materials->end(),out->mMaterials);
        conv.materials.dismiss();
    }

    if (conv.textures->size()) {
        out->mTextures = new aiTexture*[out->mNumTextures = static_cast<unsigned int>( conv.textures->size() )];
        std::copy(conv.textures->begin(),conv.textures->end(),out->mTextures);
        conv.textures.dismiss();
    }

    // acknowledge that the scene might come out incomplete
    // by Assimp's definition of `complete`: blender scenes
    // can consist of thousands of cameras or lights with
    // not a single mesh between them.
    if (!out->mNumMeshes) {
        out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}